

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O3

MatrixXd * __thiscall
ChebTools::ChebyshevExpansion::companion_matrix
          (MatrixXd *__return_storage_ptr__,ChebyshevExpansion *this,VectorXd *coeffs)

{
  VectorXd new_mc;
  ArrayXd local_30;
  double *local_20;
  
  reduce_zeros((ChebyshevExpansion *)&stack0xffffffffffffffe0,coeffs);
  Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)&local_30,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&stack0xffffffffffffffe0);
  rootfinding::companion_matrix(__return_storage_ptr__,&local_30);
  free(local_30.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_20);
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd ChebyshevExpansion::companion_matrix(const Eigen::VectorXd &coeffs) const {
        Eigen::VectorXd new_mc = reduce_zeros(coeffs);
        return companion_matrix_noreduce(new_mc);
    }